

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access_log.c
# Opt level: O3

h2o_logger_t * h2o_access_log_register(h2o_pathconf_t *pathconf,h2o_access_log_filehandle_t *fh)

{
  h2o_logger_t *phVar1;
  
  phVar1 = h2o_create_logger(pathconf,0x30);
  phVar1->dispose = dispose;
  phVar1->log_access = log_access;
  phVar1[1]._config_slot = (size_t)fh;
  if (fh[-1].logconf != (h2o_logconf_t *)0x0) {
    fh[-1].logconf = (h2o_logconf_t *)((long)&((fh[-1].logconf)->elements).entries + 1);
    return phVar1;
  }
  __assert_fail("entry->refcnt != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/include/h2o/memory.h"
                ,0x15b,"void h2o_mem_addref_shared(void *)");
}

Assistant:

h2o_logger_t *h2o_access_log_register(h2o_pathconf_t *pathconf, h2o_access_log_filehandle_t *fh)
{
    struct st_h2o_access_logger_t *self = (void *)h2o_create_logger(pathconf, sizeof(*self));

    self->super.dispose = dispose;
    self->super.log_access = log_access;
    self->fh = fh;
    h2o_mem_addref_shared(fh);

    return &self->super;
}